

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconnect.cpp
# Opt level: O1

void __thiscall ReconnectingHub::~ReconnectingHub(ReconnectingHub *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  *(undefined ***)this = &PTR__ReconnectingHub_00104d40;
  pcVar2 = (this->target)._M_dataplus._M_p;
  paVar1 = &(this->target).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  Dashel::Hub::~Hub(&this->super_Hub);
  operator_delete(this,0xa0);
  return;
}

Assistant:

ReconnectingHub(const string& target) :
		connected(false),
		target(target)
	{
		connectToTarget();
	}